

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

bool __thiscall
HighsLpRelaxation::computeDualProof
          (HighsLpRelaxation *this,HighsDomain *globaldomain,double upperbound,
          vector<int,_std::allocator<int>_> *inds,vector<double,_std::allocator<double>_> *vals,
          double *rhs,bool extractCliques)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer piVar4;
  HighsMipSolver *pHVar5;
  iterator __position;
  iterator __position_00;
  HighsInt *pHVar6;
  bool bVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  undefined7 in_register_00000089;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double val;
  vector<double,_std::allocator<double>_> row_dual;
  double local_70;
  double local_68;
  int local_60;
  undefined4 local_5c;
  double *local_58;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_5c = (undefined4)CONCAT71(in_register_00000089,extractCliques);
  local_58 = rhs;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,&(this->lpsolver).solution_.row_dual);
  uVar8 = (ulong)(uint)(this->lpsolver).model_.lp_.num_row_;
  local_68 = upperbound;
  if (uVar8 == 0) {
    local_70 = 0.0;
  }
  else {
    pdVar2 = (this->lpsolver).model_.lp_.row_lower_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3 = (this->lpsolver).model_.lp_.row_upper_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar10 = 0;
    local_70 = 0.0;
    do {
      dVar14 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10];
      if (dVar14 <= 0.0) {
        if (dVar14 < 0.0) {
          dVar15 = pdVar3[uVar10];
          if (INFINITY <= dVar15) goto LAB_002b158f;
          goto LAB_002b152f;
        }
      }
      else {
        dVar15 = pdVar2[uVar10];
        if (dVar15 <= -INFINITY) {
LAB_002b158f:
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = 0.0;
        }
        else {
LAB_002b152f:
          dVar14 = dVar14 * dVar15;
          dVar15 = local_68 - dVar14;
          local_70 = local_70 +
                     (local_68 - (dVar14 + dVar15)) + (-dVar14 - (dVar15 - (dVar14 + dVar15)));
          local_68 = dVar15;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  piVar4 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar4;
  }
  pdVar2 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar2;
  }
  std::vector<int,_std::allocator<int>_>::reserve(inds,(long)(this->lpsolver).model_.lp_.num_col_);
  std::vector<double,_std::allocator<double>_>::reserve
            (vals,(long)(this->lpsolver).model_.lp_.num_col_);
  local_60 = 0;
  bVar12 = (this->lpsolver).model_.lp_.num_col_ == 0;
  while (!bVar12) {
    piVar4 = (this->lpsolver).model_.lp_.a_matrix_.start_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    iVar9 = piVar4[local_60];
    iVar1 = piVar4[(long)local_60 + 1];
    dVar14 = (this->lpsolver).model_.lp_.col_cost_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[local_60];
    if (iVar1 == iVar9) {
      local_50 = 0.0;
    }
    else {
      local_50 = 0.0;
      lVar11 = 0;
      dVar15 = dVar14;
      do {
        dVar13 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(this->lpsolver).model_.lp_.a_matrix_.index_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[iVar9 + lVar11]];
        if ((dVar13 != 0.0) || (dVar14 = dVar15, NAN(dVar13))) {
          dVar13 = dVar13 * (this->lpsolver).model_.lp_.a_matrix_.value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar9 + lVar11];
          dVar14 = dVar15 - dVar13;
          local_50 = local_50 +
                     (dVar15 - (dVar13 + dVar14)) + (-dVar13 - (dVar14 - (dVar13 + dVar14)));
        }
        lVar11 = lVar11 + 1;
        dVar15 = dVar14;
      } while (iVar1 - iVar9 != (int)lVar11);
    }
    local_50 = local_50 + dVar14;
    pHVar5 = this->mipsolver;
    iVar9 = 7;
    if ((pHVar5->options_mip_->super_HighsOptionsStruct).small_matrix_value < ABS(local_50)) {
      dVar14 = ((pHVar5->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      bVar7 = ABS(local_50) <= dVar14;
      if (bVar7) {
LAB_002b1752:
        if (bVar7) {
          if (0.0 <= local_50) {
            dVar14 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_60];
            if (dVar14 <= -INFINITY) goto LAB_002b17e5;
          }
          else {
            dVar14 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_60];
            if (INFINITY <= dVar14) {
LAB_002b17e5:
              iVar9 = 1;
              goto LAB_002b1854;
            }
          }
          dVar14 = local_50 * dVar14;
          dVar15 = local_68 - dVar14;
          local_70 = local_70 +
                     (local_68 - (dVar14 + dVar15)) + (-dVar14 - (dVar15 - (dVar14 + dVar15)));
          local_68 = dVar15;
          goto LAB_002b1854;
        }
      }
      else {
        dVar15 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_60];
        dVar13 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_60];
        if (((dVar15 == dVar13) && (!NAN(dVar15) && !NAN(dVar13))) ||
           ((pHVar5->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[local_60] == kContinuous)) {
          if (local_50 <= 0.0) {
            dVar15 = dVar13 - (this->lpsolver).solution_.col_value.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[local_60];
          }
          else {
            dVar15 = (this->lpsolver).solution_.col_value.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[local_60] - dVar15;
          }
          bVar7 = dVar15 <= dVar14;
          goto LAB_002b1752;
        }
      }
      __position._M_current =
           (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)vals,__position,&local_50);
      }
      else {
        *__position._M_current = local_50;
        (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      __position_00._M_current =
           (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position_00._M_current ==
          (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        iVar9 = 0;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)inds,__position_00,&local_60);
      }
      else {
        *__position_00._M_current = local_60;
        (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position_00._M_current + 1;
        iVar9 = 0;
      }
    }
LAB_002b1854:
    if ((iVar9 != 7) && (iVar9 != 0)) goto LAB_002b18e4;
    local_60 = local_60 + 1;
    bVar12 = local_60 == (this->lpsolver).model_.lp_.num_col_;
  }
  *local_58 = local_70 + local_68;
  pHVar6 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  HighsDomain::tightenCoefficients
            (globaldomain,pHVar6,
             (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (HighsInt)
             ((ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pHVar6) >> 2),local_58);
  if ((char)local_5c != '\0') {
    pHVar6 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    HighsCliqueTable::extractCliquesFromCut
              (&((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cliquetable,
               this->mipsolver,pHVar6,
               (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (HighsInt)
               ((ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)pHVar6) >> 2),*local_58);
  }
LAB_002b18e4:
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool HighsLpRelaxation::computeDualProof(const HighsDomain& globaldomain,
                                         double upperbound,
                                         std::vector<HighsInt>& inds,
                                         std::vector<double>& vals, double& rhs,
                                         bool extractCliques) const {
#if 0
  const HighsBasis& basis = lpsolver.getBasis();
  const HighsSolution& sol = lpsolver.getSolution();
  HighsCDouble proofRhs = upperbound;
  assert(lpsolver.getInfo().max_dual_infeasibility <=
         mipsolver.mipdata_->feastol);

  proofRhs -= lpsolver.getInfo().objective_function_value;
  inds.clear();
  vals.clear();
  double maxVal = 0.0;
  double maxValGlb = 0.0;
  double sumLocal = 0.0;
  HighsInt numLocalCols = 0;
  const HighsInt numCol = lpsolver.getNumCol();
  for (HighsInt i : mipsolver.mipdata_->integral_cols) {
    if (basis.col_status[i] == HighsBasisStatus::kBasic) continue;

    if (sol.col_dual[i] > kHighsTiny) {
      if (sol.col_value[i] != globaldomain.col_lower_[i]) {
        maxVal = std::max(sol.col_dual[i], maxVal);
        sumLocal += sol.col_dual[i];
        ++numLocalCols;
      }
    } else if (sol.col_dual[i] < -kHighsTiny) {
      if (sol.col_value[i] != globaldomain.col_upper_[i]) {
        maxVal = std::max(-sol.col_dual[i], maxVal);
        sumLocal += -sol.col_dual[i];
        ++numLocalCols;
      }
    } else
      continue;

    proofRhs += sol.col_value[i] * sol.col_dual[i];

    vals.push_back(sol.col_dual[i]);
    inds.push_back(i);
  }

  int expShift;
  std::frexp(maxVal - mipsolver.mipdata_->epsilon, &expShift);
  expShift = -expShift;

  HighsInt len = vals.size();

  double minGlbVal = numLocalCols == 0
                         ? 0.0
                         : std::ldexp(sumLocal / numLocalCols, expShift) -
                               mipsolver.mipdata_->feastol;

  for (HighsInt i = len - 1; i >= 0; --i) {
    HighsInt iCol = inds[i];
    double val = std::ldexp(vals[i], expShift);

    bool remove = false;

    double absVal = std::fabs(val);
    if (absVal <= mipsolver.mipdata_->feastol || globaldomain.isFixed(iCol)) {
      if (vals[i] > 0) {
        if (globaldomain.col_lower_[iCol] == -kHighsInf) return false;
        proofRhs -= vals[i] * globaldomain.col_lower_[iCol];
      } else {
        if (globaldomain.col_upper_[iCol] == kHighsInf) return false;
        proofRhs -= vals[i] * globaldomain.col_upper_[iCol];
      }

      remove = true;
    } else if (absVal < minGlbVal) {
      if (vals[i] > 0)
        remove = sol.col_value[iCol] == globaldomain.col_lower_[iCol];
      else
        remove = sol.col_value[iCol] == globaldomain.col_upper_[iCol];

      if (remove) proofRhs -= vals[i] * sol.col_value[iCol];
    }

    if (remove) {
      --len;
      vals[i] = vals[len];
      inds[i] = inds[len];
    } else {
      vals[i] = val;
    }
  }

  vals.resize(len);
  inds.resize(len);

  rhs = std::ldexp(double(proofRhs), expShift);

  globaldomain.tightenCoefficients(inds.data(), vals.data(), inds.size(), rhs);

  mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                             inds.size(), rhs);
  if (extractCliques)
    mipsolver.mipdata_->cliquetable.extractCliquesFromCut(
        mipsolver, inds.data(), vals.data(), inds.size(), rhs);

  return true;
#else
  std::vector<double> row_dual = lpsolver.getSolution().row_dual;

  const HighsLp& lp = lpsolver.getLp();

  assert(std::isfinite(upperbound));
  HighsCDouble upper = upperbound;

  for (HighsInt i = 0; i != lp.num_row_; ++i) {
    // @FlipRowDual row_dual[i] < 0 became row_dual[i] > 0
    if (row_dual[i] > 0) {
      if (lp.row_lower_[i] != -kHighsInf)
        // @FlipRowDual += became -=
        upper -= row_dual[i] * lp.row_lower_[i];
      else
        row_dual[i] = 0;
      // @FlipRowDual row_dual[i] > 0 became row_dual[i] < 0
    } else if (row_dual[i] < 0) {
      if (lp.row_upper_[i] != kHighsInf)
        // @FlipRowDual += became -=
        upper -= row_dual[i] * lp.row_upper_[i];
      else
        row_dual[i] = 0;
    }
  }

  inds.clear();
  vals.clear();
  inds.reserve(lp.num_col_);
  vals.reserve(lp.num_col_);
  for (HighsInt i = 0; i != lp.num_col_; ++i) {
    HighsInt start = lp.a_matrix_.start_[i];
    HighsInt end = lp.a_matrix_.start_[i + 1];

    HighsCDouble sum = lp.col_cost_[i];

    for (HighsInt j = start; j != end; ++j) {
      if (row_dual[lp.a_matrix_.index_[j]] == 0) continue;
      // @FlipRowDual += became -=
      sum -= lp.a_matrix_.value_[j] * row_dual[lp.a_matrix_.index_[j]];
    }

    double val = double(sum);

    if (std::fabs(val) <= mipsolver.options_mip_->small_matrix_value) continue;

    bool removeValue = std::fabs(val) <= mipsolver.mipdata_->feastol;

    if (!removeValue &&
        (globaldomain.col_lower_[i] == globaldomain.col_upper_[i] ||
         mipsolver.variableType(i) == HighsVarType::kContinuous)) {
      if (val > 0)
        removeValue =
            lpsolver.getSolution().col_value[i] - globaldomain.col_lower_[i] <=
            mipsolver.mipdata_->feastol;
      else
        removeValue =
            globaldomain.col_upper_[i] - lpsolver.getSolution().col_value[i] <=
            mipsolver.mipdata_->feastol;
    }

    if (removeValue) {
      if (val < 0) {
        if (globaldomain.col_upper_[i] == kHighsInf) return false;
        upper -= val * globaldomain.col_upper_[i];
      } else {
        if (globaldomain.col_lower_[i] == -kHighsInf) return false;

        upper -= val * globaldomain.col_lower_[i];
      }

      continue;
    }

    vals.push_back(val);
    inds.push_back(i);
  }

  rhs = double(upper);
  assert(std::isfinite(rhs));
  globaldomain.tightenCoefficients(inds.data(), vals.data(), inds.size(), rhs);

  mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                             inds.size(), rhs);
  if (extractCliques)
    mipsolver.mipdata_->cliquetable.extractCliquesFromCut(
        mipsolver, inds.data(), vals.data(), inds.size(), rhs);

  return true;
#endif
}